

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O3

ion_err_t oah_find_item_loc(ion_hashmap_t *hash_map,ion_key_t key,int *location)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  iVar3 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  iVar5 = hash_map->map_size;
  if (iVar5 != 0) {
    uVar7 = (long)iVar3 % (long)iVar5 & 0xffffffff;
    iVar3 = 0;
    do {
      iVar1 = (hash_map->super).record.key_size;
      iVar6 = (int)uVar7;
      lVar4 = (long)(((hash_map->super).record.value_size + iVar1 + 1) * iVar6);
      cVar2 = hash_map->entry[lVar4];
      if (cVar2 != -2) {
        if (cVar2 == -1) {
          return '\x01';
        }
        cVar2 = (*(hash_map->super).compare)(hash_map->entry + lVar4 + 1,key,iVar1);
        if (cVar2 == '\0') {
          *location = iVar6;
          return '\0';
        }
        iVar5 = hash_map->map_size;
      }
      iVar3 = iVar3 + 1;
      uVar7 = (ulong)(iVar6 + 1U);
      if (iVar5 <= (int)(iVar6 + 1U)) {
        uVar7 = 0;
      }
    } while (iVar3 != iVar5);
  }
  return '\x01';
}

Assistant:

ion_err_t
oah_find_item_loc(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	int				*location
) {
	/* compute hash value for given key */
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);

	int loc			= oah_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	while (count != hash_map->map_size) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if (item->status == ION_EMPTY) {
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					return err_ok;
				}
			}

			count++;
			loc++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
			}
		}
	}

	return err_item_not_found;	/* key have not been found */
}